

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O0

Gia_Man_t * Gia_ManOrigIdsReduce(Gia_Man_t *p,Vec_Int_t *vPairs)

{
  int iVar1;
  int iLit1;
  uint uVar2;
  Vec_Int_t *p_00;
  Gia_Man_t *p_01;
  char *pcVar3;
  Gia_Obj_t *pGVar4;
  Gia_Rpr_t *pGVar5;
  int *piVar6;
  bool bVar7;
  int iRepr;
  Vec_Int_t *vMap;
  int i;
  Gia_Obj_t *pRepr;
  Gia_Obj_t *pObj;
  Gia_Man_t *pNew;
  Vec_Int_t *vPairs_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ManObjNum(p);
  p_00 = Gia_ManOrigIdsRemapPairs(vPairs,iVar1);
  Gia_ManSetPhase(p);
  iVar1 = Gia_ManObjNum(p);
  p_01 = Gia_ManStart(iVar1);
  pcVar3 = Abc_UtilStrsav(p->pSpec);
  p_01->pSpec = pcVar3;
  pcVar3 = Abc_UtilStrsav(p->pName);
  p_01->pName = pcVar3;
  Gia_ManFillValue(p);
  pGVar4 = Gia_ManConst0(p);
  pGVar4->Value = 0;
  vMap._4_4_ = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p->vCis);
    bVar7 = false;
    if ((int)vMap._4_4_ < iVar1) {
      pRepr = Gia_ManCi(p,vMap._4_4_);
      bVar7 = pRepr != (Gia_Obj_t *)0x0;
    }
    if (!bVar7) break;
    uVar2 = Gia_ManAppendCi(p_01);
    pRepr->Value = uVar2;
    vMap._4_4_ = vMap._4_4_ + 1;
  }
  Gia_ManHashAlloc(p_01);
  vMap._4_4_ = 0;
  while( true ) {
    bVar7 = false;
    if ((int)vMap._4_4_ < p->nObjs) {
      pRepr = Gia_ManObj(p,vMap._4_4_);
      bVar7 = pRepr != (Gia_Obj_t *)0x0;
    }
    if (!bVar7) break;
    iVar1 = Gia_ObjIsAnd(pRepr);
    if (iVar1 != 0) {
      iVar1 = Vec_IntEntry(p_00,vMap._4_4_);
      if (iVar1 == -1) {
        iVar1 = Gia_ObjFanin0Copy(pRepr);
        iLit1 = Gia_ObjFanin1Copy(pRepr);
        uVar2 = Gia_ManHashAnd(p_01,iVar1,iLit1);
        pRepr->Value = uVar2;
      }
      else {
        iVar1 = Vec_IntEntry(p_00,vMap._4_4_);
        pGVar4 = Gia_ManObj(p,iVar1);
        uVar2 = Abc_LitNotCond(pGVar4->Value,
                               ((uint)((ulong)*(undefined8 *)pGVar4 >> 0x20) ^
                               (uint)((ulong)*(undefined8 *)pRepr >> 0x20)) >> 0x1f);
        pRepr->Value = uVar2;
      }
    }
    vMap._4_4_ = vMap._4_4_ + 1;
  }
  Gia_ManHashStop(p_01);
  vMap._4_4_ = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p->vCos);
    bVar7 = false;
    if ((int)vMap._4_4_ < iVar1) {
      pRepr = Gia_ManCo(p,vMap._4_4_);
      bVar7 = pRepr != (Gia_Obj_t *)0x0;
    }
    if (!bVar7) break;
    iVar1 = Gia_ObjFanin0Copy(pRepr);
    uVar2 = Gia_ManAppendCo(p_01,iVar1);
    pRepr->Value = uVar2;
    vMap._4_4_ = vMap._4_4_ + 1;
  }
  Vec_IntFree(p_00);
  if ((p->pReprs == (Gia_Rpr_t *)0x0) && (p->pNexts == (int *)0x0)) {
    iVar1 = Gia_ManObjNum(p);
    pGVar5 = (Gia_Rpr_t *)calloc((long)iVar1,4);
    p->pReprs = pGVar5;
    for (vMap._4_4_ = 0; iVar1 = Gia_ManObjNum(p), (int)vMap._4_4_ < iVar1;
        vMap._4_4_ = vMap._4_4_ + 1) {
      Gia_ObjSetRepr(p,vMap._4_4_,0xfffffff);
    }
    Gia_ManFillValue(p_01);
    vMap._4_4_ = 0;
    while( true ) {
      bVar7 = false;
      if ((int)vMap._4_4_ < p->nObjs) {
        pRepr = Gia_ManObj(p,vMap._4_4_);
        bVar7 = pRepr != (Gia_Obj_t *)0x0;
      }
      if (!bVar7) break;
      iVar1 = Gia_ObjIsAnd(pRepr);
      if (iVar1 != 0) {
        iVar1 = Abc_Lit2Var(pRepr->Value);
        if (iVar1 == 0) {
          Gia_ObjSetRepr(p,vMap._4_4_,0);
        }
        else {
          pGVar4 = Gia_ManObj(p_01,iVar1);
          if (pGVar4->Value == 0xffffffff) {
            pGVar4->Value = vMap._4_4_;
          }
          else {
            Gia_ObjSetRepr(p,vMap._4_4_,pGVar4->Value);
          }
        }
      }
      vMap._4_4_ = vMap._4_4_ + 1;
    }
    piVar6 = Gia_ManDeriveNexts(p);
    p->pNexts = piVar6;
    return p_01;
  }
  __assert_fail("!p->pReprs && !p->pNexts",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEquiv.c"
                ,0x87,"Gia_Man_t *Gia_ManOrigIdsReduce(Gia_Man_t *, Vec_Int_t *)");
}

Assistant:

Gia_Man_t * Gia_ManOrigIdsReduce( Gia_Man_t * p, Vec_Int_t * vPairs )
{
    Gia_Man_t * pNew = NULL;
    Gia_Obj_t * pObj, * pRepr; int i;
    Vec_Int_t * vMap = Gia_ManOrigIdsRemapPairs( vPairs, Gia_ManObjNum(p) );
    Gia_ManSetPhase( p );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    pNew->pName = Abc_UtilStrsav( p->pName );
    Gia_ManFillValue(p);
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    Gia_ManHashAlloc( pNew );
    Gia_ManForEachAnd( p, pObj, i )
    {
        if ( Vec_IntEntry(vMap, i) == -1 )
            pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        else
        {
            pRepr = Gia_ManObj( p, Vec_IntEntry(vMap, i) );
            pObj->Value = Abc_LitNotCond( pRepr->Value, pRepr->fPhase ^ pObj->fPhase );
        }
    }
    Gia_ManHashStop( pNew );
    Gia_ManForEachCo( p, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Vec_IntFree( vMap );
    // compute equivalences
    assert( !p->pReprs && !p->pNexts );
    p->pReprs = ABC_CALLOC( Gia_Rpr_t, Gia_ManObjNum(p) );
    for ( i = 0; i < Gia_ManObjNum(p); i++ )
        Gia_ObjSetRepr( p, i, GIA_VOID );
    Gia_ManFillValue(pNew);
    Gia_ManForEachAnd( p, pObj, i )
    {
        int iRepr = Abc_Lit2Var(pObj->Value);
        if ( iRepr == 0 )
        {
            Gia_ObjSetRepr( p, i, 0 );
            continue;
        }
        pRepr = Gia_ManObj( pNew, iRepr );
        if ( !~pRepr->Value ) // first time
        {
            pRepr->Value = i;
            continue;
        }
        // add equivalence
        Gia_ObjSetRepr( p, i, pRepr->Value );
    }
    p->pNexts = Gia_ManDeriveNexts( p );
    return pNew;
}